

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     rcl<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (modify_t<unsigned_char> destination,uint8_t count,Context *context)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  byte bVar4;
  undefined7 in_register_00000031;
  
  bVar4 = count + (char)((uint)((int)CONCAT71(in_register_00000031,count) * 0x39) >> 9) * -9;
  uVar2 = (context->flags).carry_;
  uVar3 = (uint)(uVar2 != 0);
  if (bVar4 != 0) {
    if (bVar4 == 8) {
      uVar3 = (uint)(*destination & 1);
      *destination = (uVar2 != 0) << 7 | *destination >> 1;
    }
    else {
      bVar1 = *destination;
      *destination = (uVar2 != 0) << (bVar4 - 1 & 0x1f) |
                     bVar1 >> (9 - bVar4 & 0x1f) | bVar1 << (bVar4 & 0x1f);
      uVar3 = ((uint)bVar1 << (bVar4 - 1 & 0x1f) & 0xff) >> 7;
    }
  }
  (context->flags).carry_ = uVar3;
  (context->flags).overflow_ = (uint)(byte)((byte)uVar3 ^ *destination >> 7);
  return;
}

Assistant:

void rcl(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	/*
		(* RCL and RCR instructions *)
		SIZE ← OperandSize
		CASE (determine count) OF
			SIZE = 8:	tempCOUNT ← (COUNT AND 1FH) MOD 9;
			SIZE = 16:	tempCOUNT ← (COUNT AND 1FH) MOD 17;
			SIZE = 32:	tempCOUNT ← COUNT AND 1FH;
		ESAC;
	*/
	/*
		(* RCL instruction operation *)
		WHILE (tempCOUNT ≠ 0)
			DO
				tempCF ← MSB(DEST);
				DEST ← (DEST * 2) + CF;
				CF ← tempCF;
				tempCOUNT ← tempCOUNT – 1;
			OD;
		ELIHW;
		IF COUNT = 1
			THEN OF ← MSB(DEST) XOR CF;
			ELSE OF is undefined;
		FI;
	*/
	/*
		The CF flag contains the value of the bit shifted into it.
		The OF flag is affected only for single- bit rotates (see “Description” above);
		it is undefined for multi-bit rotates. The SF, ZF, AF, and PF flags are not affected.
	*/
	const auto temp_count = count % (Numeric::bit_size<IntT>() + 1);
	auto carry = context.flags.template carry_bit<IntT>();
	switch(temp_count) {
		case 0: break;
		case Numeric::bit_size<IntT>(): {
			const IntT temp_carry = destination & 1;
			destination = IntT((destination >> 1) | (carry << (Numeric::bit_size<IntT>() - 1)));
			carry = temp_carry;
		} break;
		default: {
			const IntT temp_carry = destination & (Numeric::top_bit<IntT>() >> (temp_count - 1));
			destination = IntT(
				(destination << temp_count) |
				(destination >> (Numeric::bit_size<IntT>() + 1 - temp_count)) |
				(carry << (temp_count - 1))
			);
			carry = temp_carry ? 1 : 0;
		} break;
	}

	context.flags.template set_from<Flag::Carry>(carry);
	context.flags.template set_from<Flag::Overflow>(
		((destination >> (Numeric::bit_size<IntT>() - 1)) & 1) ^ carry
	);
}